

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

void __thiscall Assimp::ZipFile::ZipFile(ZipFile *this,size_t size)

{
  uchar *puVar1;
  
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__ZipFile_008da318;
  this->m_Size = size;
  this->m_SeekPtr = 0;
  (this->m_Buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if (size != 0) {
    puVar1 = (uchar *)operator_new__(size);
    (this->m_Buffer)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar1;
    return;
  }
  __assert_fail("m_Size != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0xf5,"Assimp::ZipFile::ZipFile(size_t)");
}

Assistant:

ZipFile::ZipFile(size_t size)
        : m_Size(size) {
        ai_assert(m_Size != 0);
        m_Buffer = std::unique_ptr<uint8_t[]>(new uint8_t[m_Size]);
    }